

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base.cpp
# Opt level: O3

int __thiscall xmrig::Base::init(Base *this,EVP_PKEY_CTX *ctx)

{
  pointer *pppIVar1;
  iterator __position;
  Api *this_00;
  CpuConfig *pCVar2;
  ConsoleLog *this_01;
  FileLog *this_02;
  Config *pCVar3;
  ILogBackend *backend;
  BasePrivate *pBVar4;
  IApiListener *local_20;
  
  this_00 = (Api *)operator_new(0xd8);
  Api::Api(this_00,this);
  this->d_ptr->api = this_00;
  local_20 = &this->super_IApiListener;
  __position._M_current =
       (this_00->m_listeners).
       super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->m_listeners).
      super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<xmrig::IApiListener*,std::allocator<xmrig::IApiListener*>>::
    _M_realloc_insert<xmrig::IApiListener*const&>
              ((vector<xmrig::IApiListener*,std::allocator<xmrig::IApiListener*>> *)
               &this_00->m_listeners,__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    pppIVar1 = &(this_00->m_listeners).
                super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  Platform::init((EVP_PKEY_CTX *)(this->d_ptr->config->super_BaseConfig).m_userAgent.m_data);
  pCVar2 = Config::cpu(this->d_ptr->config);
  Platform::setProcessPriority(pCVar2->m_priority);
  pBVar4 = this->d_ptr;
  pCVar3 = pBVar4->config;
  if ((pCVar3 == (Config *)0x0) || ((pCVar3->super_BaseConfig).m_background != true)) {
    this_01 = (ConsoleLog *)operator_new(0x10);
    ConsoleLog::ConsoleLog(this_01);
    Log::add((ILogBackend *)this_01);
    pBVar4 = this->d_ptr;
    pCVar3 = pBVar4->config;
  }
  else {
    Log::background = 1;
  }
  if ((pCVar3->super_BaseConfig).m_logFile.m_data != (char *)0x0) {
    this_02 = (FileLog *)operator_new(0x10);
    FileLog::FileLog(this_02,(pBVar4->config->super_BaseConfig).m_logFile.m_data);
    Log::add((ILogBackend *)this_02);
    pCVar3 = this->d_ptr->config;
  }
  if ((pCVar3->super_BaseConfig).m_syslog == true) {
    backend = (ILogBackend *)operator_new(8);
    SysLog::SysLog((SysLog *)backend);
    Log::add(backend);
  }
  return 0;
}

Assistant:

int xmrig::Base::init()
{
#   ifdef XMRIG_FEATURE_API
    d_ptr->api = new Api(this);
    d_ptr->api->addListener(this);
#   endif

    Platform::init(config()->userAgent());

    Platform::setProcessPriority(config()->cpu().priority());

    if (isBackground()) {
        Log::background = true;
    }
    else {
        Log::add(new ConsoleLog());
    }

    if (config()->logFile()) {
        Log::add(new FileLog(config()->logFile()));
    }

#   ifdef HAVE_SYSLOG_H
    if (config()->isSyslog()) {
        Log::add(new SysLog());
    }
#   endif

    return 0;
}